

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::InvocationInterlockPlacementPass::placeInstructions
          (InvocationInterlockPlacementPass *this,BasicBlock *block)

{
  bool modified;
  undefined1 local_49;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  local_49 = 0;
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x18);
  *(InvocationInterlockPlacementPass **)local_48._M_unused._0_8_ = this;
  *(BasicBlock **)((long)local_48._M_unused._0_8_ + 8) = block;
  *(undefined1 **)((long)local_48._M_unused._0_8_ + 0x10) = &local_49;
  pcStack_30 = std::
               _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:386:32)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:386:32)>
             ::_M_manager;
  BasicBlock::ForEachSuccessorLabel(block,(function<void_(unsigned_int)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return (bool)local_49;
}

Assistant:

bool InvocationInterlockPlacementPass::placeInstructions(BasicBlock* block) {
  bool modified = false;

  block->ForEachSuccessorLabel([this, block, &modified](uint32_t succ_id) {
    modified |= placeInstructionsForEdge(
        block, succ_id, after_begin_, predecessors_after_begin_,
        spv::Op::OpBeginInvocationInterlockEXT, /* reverse_cfg= */ true);
    modified |= placeInstructionsForEdge(cfg()->block(succ_id), block->id(),
                                         before_end_, successors_before_end_,
                                         spv::Op::OpEndInvocationInterlockEXT,
                                         /* reverse_cfg= */ false);
  });

  return modified;
}